

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

XrFormFactor GetXrFormFactor(string *formFactorStr)

{
  string *s1;
  bool bVar1;
  invalid_argument *this;
  undefined8 uVar2;
  string local_a8 [32];
  locale local_88 [15];
  allocator local_79;
  string local_78 [32];
  locale local_58 [31];
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *formFactorStr_local;
  
  local_18 = formFactorStr;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Hmd",&local_39);
  std::locale::locale(local_58);
  bVar1 = EqualsIgnoreCase(formFactorStr,(string *)local_38,local_58);
  std::locale::~locale(local_58);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  s1 = local_18;
  if (bVar1) {
    formFactorStr_local._4_4_ = XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Handheld",&local_79);
    std::locale::locale(local_88);
    bVar1 = EqualsIgnoreCase(s1,(string *)local_78,local_88);
    std::locale::~locale(local_88);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if (!bVar1) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      uVar2 = std::__cxx11::string::c_str();
      Fmt_abi_cxx11_((char *)local_a8,"Unknown form factor \'%s\'",uVar2);
      std::invalid_argument::invalid_argument(this,local_a8);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    formFactorStr_local._4_4_ = XR_FORM_FACTOR_HANDHELD_DISPLAY;
  }
  return formFactorStr_local._4_4_;
}

Assistant:

inline XrFormFactor GetXrFormFactor(const std::string& formFactorStr) {
    if (EqualsIgnoreCase(formFactorStr, "Hmd")) {
        return XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY;
    }
    if (EqualsIgnoreCase(formFactorStr, "Handheld")) {
        return XR_FORM_FACTOR_HANDHELD_DISPLAY;
    }
    throw std::invalid_argument(Fmt("Unknown form factor '%s'", formFactorStr.c_str()));
}